

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_add_uint(tnt_stream *s,uint64_t value)

{
  long lVar1;
  char *pcVar2;
  ssize_t sVar3;
  char *end;
  char data [10];
  tnt_sbuf_object *sbo;
  uint64_t value_local;
  tnt_stream *s_local;
  
  data._2_8_ = *(long *)((long)s->data + 0x30);
  if ((char)*(long *)(data._2_8_ + 8) != '\0') {
    lVar1 = *(long *)data._2_8_ + (long)(int)(*(byte *)(data._2_8_ + 8) - 1) * 0x10;
    *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
  }
  pcVar2 = mp_encode_uint((char *)((long)&end + 6),value);
  sVar3 = (*s->write)(s,(char *)((long)&end + 6),(long)pcVar2 - ((long)&end + 6));
  return sVar3;
}

Assistant:

ssize_t
tnt_object_add_uint(struct tnt_stream *s, uint64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}